

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::js::Generator::GenerateClassFieldFromObject
          (Generator *this,GeneratorOptions *options,Printer *printer,FieldDescriptor *field)

{
  bool bVar1;
  Type TVar2;
  FieldDescriptor *this_00;
  GeneratorOptions *options_00;
  FieldDescriptor *field_00;
  undefined1 *field_01;
  GeneratorOptions *options_01;
  FieldDescriptor *field_02;
  GeneratorOptions *options_02;
  FieldDescriptor *field_03;
  FieldDescriptor *field_04;
  FieldDescriptor *field_05;
  FieldDescriptor *field_06;
  string local_80;
  string local_60;
  string local_40;
  
  field_00 = field;
  bVar1 = FieldDescriptor::is_map(field);
  if (bVar1) {
    this_00 = anon_unknown_0::MapFieldValue(field);
    TVar2 = FieldDescriptor::type(this_00);
    if (TVar2 != TYPE_MESSAGE) {
      (anonymous_namespace)::JSObjectFieldName_abi_cxx11_
                (&local_60,(_anonymous_namespace_ *)field,options_01,field_00);
      (anonymous_namespace)::JSFieldIndex_abi_cxx11_
                (&local_80,(_anonymous_namespace_ *)field,field_04);
      io::Printer::Print(printer,
                         "  goog.isDef(obj.$name$) && jspb.Message.setField(msg, $index$, obj.$name$);\n"
                         ,"name",&local_60,"index",&local_80);
      goto LAB_0022473c;
    }
    (anonymous_namespace)::JSObjectFieldName_abi_cxx11_
              (&local_60,(_anonymous_namespace_ *)field,options_01,field_00);
    (anonymous_namespace)::JSFieldIndex_abi_cxx11_
              (&local_80,(_anonymous_namespace_ *)field,field_02);
    options_00 = (GeneratorOptions *)FieldDescriptor::message_type(this_00);
    (anonymous_namespace)::GetMessagePath_abi_cxx11_
              (&local_40,(_anonymous_namespace_ *)options,options_00,(Descriptor *)field_00);
    io::Printer::Print(printer,
                       "  goog.isDef(obj.$name$) && jspb.Message.setWrapperField(\n      msg, $index$, jspb.Map.fromObject(obj.$name$, $fieldclass$, $fieldclass$.fromObject));\n"
                       ,"name",&local_60,"index",&local_80,"fieldclass",&local_40);
  }
  else {
    TVar2 = FieldDescriptor::type(field);
    field_01 = FieldDescriptor::kTypeToCppTypeMap;
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar2 * 4) != 10) {
      (anonymous_namespace)::JSObjectFieldName_abi_cxx11_
                (&local_60,(_anonymous_namespace_ *)field,options_02,
                 (FieldDescriptor *)FieldDescriptor::kTypeToCppTypeMap);
      (anonymous_namespace)::JSFieldIndex_abi_cxx11_
                (&local_80,(_anonymous_namespace_ *)field,field_05);
      io::Printer::Print(printer,
                         "  goog.isDef(obj.$name$) && jspb.Message.setField(msg, $index$, obj.$name$);\n"
                         ,"name",&local_60,"index",&local_80);
      goto LAB_0022473c;
    }
    if (*(int *)(field + 0x4c) == 3) {
      (anonymous_namespace)::JSObjectFieldName_abi_cxx11_
                (&local_60,(_anonymous_namespace_ *)field,options_02,
                 (FieldDescriptor *)FieldDescriptor::kTypeToCppTypeMap);
      (anonymous_namespace)::JSFieldIndex_abi_cxx11_
                (&local_80,(_anonymous_namespace_ *)field,field_03);
      (anonymous_namespace)::SubmessageTypeRef_abi_cxx11_
                (&local_40,(_anonymous_namespace_ *)options,(GeneratorOptions *)field,
                 (FieldDescriptor *)field_01);
      io::Printer::Print(printer,
                         "  goog.isDef(obj.$name$) && jspb.Message.setRepeatedWrapperField(\n      msg, $index$, goog.array.map(obj.$name$, function(i) {\n        return $fieldclass$.fromObject(i);\n      }));\n"
                         ,"name",&local_60,"index",&local_80,"fieldclass",&local_40);
    }
    else {
      (anonymous_namespace)::JSObjectFieldName_abi_cxx11_
                (&local_60,(_anonymous_namespace_ *)field,options_02,
                 (FieldDescriptor *)FieldDescriptor::kTypeToCppTypeMap);
      (anonymous_namespace)::JSFieldIndex_abi_cxx11_
                (&local_80,(_anonymous_namespace_ *)field,field_06);
      (anonymous_namespace)::SubmessageTypeRef_abi_cxx11_
                (&local_40,(_anonymous_namespace_ *)options,(GeneratorOptions *)field,
                 (FieldDescriptor *)field_01);
      io::Printer::Print(printer,
                         "  goog.isDef(obj.$name$) && jspb.Message.setWrapperField(\n      msg, $index$, $fieldclass$.fromObject(obj.$name$));\n"
                         ,"name",&local_60,"index",&local_80,"fieldclass",&local_40);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
LAB_0022473c:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Generator::GenerateClassFieldFromObject(
    const GeneratorOptions& options,
    io::Printer* printer,
    const FieldDescriptor* field) const {
  if (IsMap(options, field)) {
    const FieldDescriptor* value_field = MapFieldValue(field);
    if (value_field->type() == FieldDescriptor::TYPE_MESSAGE) {
      // Since the map values are of message type, we have to do some extra work
      // to recursively call fromObject() on them before setting the map field.
      printer->Print(
          "  goog.isDef(obj.$name$) && jspb.Message.setWrapperField(\n"
          "      msg, $index$, jspb.Map.fromObject(obj.$name$, $fieldclass$, "
          "$fieldclass$.fromObject));\n",
          "name", JSObjectFieldName(options, field),
          "index", JSFieldIndex(field),
          "fieldclass", GetMessagePath(options, value_field->message_type()));
    } else {
      // `msg` is a newly-constructed message object that has not yet built any
      // map containers wrapping underlying arrays, so we can simply directly
      // set the array here without fear of a stale wrapper.
      printer->Print(
          "  goog.isDef(obj.$name$) && "
          "jspb.Message.setField(msg, $index$, obj.$name$);\n",
          "name", JSObjectFieldName(options, field),
          "index", JSFieldIndex(field));
    }
  } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
    // Message field (singular or repeated)
    if (field->is_repeated()) {
      {
        printer->Print(
            "  goog.isDef(obj.$name$) && "
            "jspb.Message.setRepeatedWrapperField(\n"
            "      msg, $index$, goog.array.map(obj.$name$, function(i) {\n"
            "        return $fieldclass$.fromObject(i);\n"
            "      }));\n",
            "name", JSObjectFieldName(options, field),
            "index", JSFieldIndex(field),
            "fieldclass", SubmessageTypeRef(options, field));
      }
    } else {
      printer->Print(
          "  goog.isDef(obj.$name$) && jspb.Message.setWrapperField(\n"
          "      msg, $index$, $fieldclass$.fromObject(obj.$name$));\n",
          "name", JSObjectFieldName(options, field),
          "index", JSFieldIndex(field),
          "fieldclass", SubmessageTypeRef(options, field));
    }
  } else {
    // Simple (primitive) field.
    printer->Print(
        "  goog.isDef(obj.$name$) && jspb.Message.setField(msg, $index$, "
        "obj.$name$);\n",
        "name", JSObjectFieldName(options, field),
        "index", JSFieldIndex(field));
  }
}